

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_widget_is_hovered(nk_context *ctx)

{
  float fVar1;
  uint uVar2;
  nk_rect bounds;
  nk_rect local_20;
  uint uVar3;
  
  uVar2 = 0;
  uVar3 = 0;
  if ((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) {
    nk_layout_peek(&local_20,ctx);
    if (ctx->active == ctx->current) {
      fVar1 = (ctx->input).mouse.pos.x;
      uVar2 = uVar3;
      if ((local_20.x <= fVar1) && (fVar1 <= local_20.x + local_20.w)) {
        fVar1 = (ctx->input).mouse.pos.y;
        if (local_20.y <= fVar1) {
          uVar2 = (uint)(fVar1 <= local_20.y + local_20.h);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

NK_API int
nk_widget_is_hovered(struct nk_context *ctx)
{
    int ret;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return 0;

    nk_layout_peek(&bounds, ctx);
    ret = (ctx->active == ctx->current);
    ret = ret && nk_input_is_mouse_hovering_rect(&ctx->input, bounds);
    return ret;
}